

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O1

iterator __thiscall JetHead::list<Timer::TimerNode>::iterator::erase(iterator *this)

{
  SmartPtr<Event> *this_00;
  Node *pNVar1;
  undefined8 *in_RSI;
  Node *pNVar2;
  
  this_00 = (SmartPtr<Event> *)*in_RSI;
  if (((this_00 == (SmartPtr<Event> *)0x0) ||
      (pNVar2 = (Node *)this_00[5].mObj, pNVar2 == (Node *)0x0)) ||
     (pNVar1 = (Node *)this_00[6].mObj, pNVar1 == (Node *)0x0)) {
    pNVar2 = (Node *)*in_RSI;
  }
  else {
    pNVar1->next = pNVar2;
    pNVar2->prev = pNVar1;
    SmartPtr<Event>::~SmartPtr(this_00);
    operator_delete(this_00,0x38);
    *in_RSI = 0;
  }
  this->mNode = pNVar2;
  return (iterator)(Node *)this;
}

Assistant:

iterator erase()
			{
				// Don't segfault, and don't delete head or tail
				// placeholder nodes 
				if (mNode == NULL or 
					mNode->next == NULL or 
					mNode->prev == NULL) 
				{
					return *this;
				}

				Node* prev = mNode->prev;
				Node* next = mNode->next;

				prev->next = next;
				next->prev = prev;

				delete mNode;
				mNode = NULL;

				iterator ret;
				ret.mNode = next;
				return ret;
			}